

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

size_t phf_primeup(size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  if (n >> 2 < 0x3fffffff) {
    do {
      if (n < 8) {
        bVar11 = (0xaeUL >> (n & 0x3f) & 1) != 0;
LAB_00155092:
        if (bVar11) {
          return n;
        }
      }
      else {
        uVar1 = 2;
        do {
          if (((0x51UL >> (uVar1 & 0x3f) & 1) == 0) &&
             (n % (ulong)(long)*(char *)((long)&phf_isprime(unsigned_long)::map + uVar1) == 0))
          goto LAB_001550d4;
          uVar1 = uVar1 + 1;
        } while (uVar1 != 8);
        if (n >> 0x20 != 0) {
          __assert_fail("n <= UINT32_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/contrib/phf/phf.cc"
                        ,0x93,"bool phf_rabinmiller(uint64_t)");
        }
        if ((n & 1) != 0) {
          uVar1 = n - 1;
          lVar8 = 1;
          uVar7 = uVar1;
          do {
            uVar4 = uVar7;
            lVar9 = lVar8;
            uVar7 = uVar4 >> 1;
            lVar8 = lVar9 + 1;
          } while ((uVar4 & 2) == 0);
          if (0x7ea < n) {
            lVar8 = 0;
            do {
              uVar2 = (ulong)(int)(&phf_rabinmiller(unsigned_long)::witness)[lVar8];
              if (n <= uVar2) {
                __assert_fail("a > 0 && a < n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/contrib/phf/phf.cc"
                              ,0x7c,"bool phf_witness(uint64_t, uint64_t, uint64_t, uint64_t)");
              }
              uVar3 = 1;
              uVar10 = uVar7;
              if (uVar4 != 0) {
                do {
                  uVar2 = uVar2 % n;
                  if ((uVar10 & 1) != 0) {
                    uVar3 = (uVar3 * uVar2) % n;
                  }
                  uVar2 = uVar2 * uVar2;
                  bVar11 = 1 < uVar10;
                  uVar10 = uVar10 >> 1;
                } while (bVar11);
              }
              lVar5 = lVar9;
              if (uVar3 != uVar1 && uVar3 != 1) {
                do {
                  if (lVar5 + -1 == 0) goto LAB_001550d4;
                  uVar3 = (uVar3 * uVar3) % n;
                  lVar5 = lVar5 + -1;
                } while (uVar3 != uVar1);
              }
              lVar8 = lVar8 + 1;
              if (lVar8 == 3) {
                return n;
              }
            } while( true );
          }
          uVar2 = 1;
          if (uVar4 != 0) {
            uVar4 = 2;
            do {
              uVar4 = uVar4 % n;
              if ((uVar7 & 1) != 0) {
                uVar2 = (uVar2 * uVar4) % n;
              }
              uVar4 = uVar4 * uVar4;
              bVar11 = 1 < uVar7;
              uVar7 = uVar7 >> 1;
            } while (bVar11);
          }
          if (uVar2 == 1) {
            return n;
          }
          if (uVar2 == uVar1) {
            return n;
          }
          while( true ) {
            lVar9 = lVar9 + -1;
            bVar11 = lVar9 != 0;
            if (lVar9 == 0) break;
            uVar2 = (uVar2 * uVar2) % n;
            if (uVar2 == uVar1) {
              return n;
            }
          }
          goto LAB_00155092;
        }
      }
LAB_001550d4:
      n = n + 1;
    } while (n != 0xffffffffffffffff);
    sVar6 = 0xffffffffffffffff;
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

static inline size_t phf_primeup(size_t n) {
	/* NB: 4294967291 is largest 32-bit prime */
	if (n > 4294967291)
		return 0;

	while (n < SIZE_MAX && !phf_isprime(n))
		n++;

	return n;
}